

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O0

image * __thiscall basisu::image::swap(image *this,image *other)

{
  vector<basisu::color_rgba> *in_RSI;
  image *in_RDI;
  
  std::swap<unsigned_int>(&in_RDI->m_width,(uint *)in_RSI);
  std::swap<unsigned_int>(&in_RDI->m_height,(uint *)((long)&in_RSI->m_p + 4));
  std::swap<unsigned_int>(&in_RDI->m_pitch,&in_RSI->m_size);
  vector<basisu::color_rgba>::swap(in_RSI,(vector<basisu::color_rgba> *)in_RDI);
  return in_RDI;
}

Assistant:

image &swap(image &other)
		{
			std::swap(m_width, other.m_width);
			std::swap(m_height, other.m_height);
			std::swap(m_pitch, other.m_pitch);
			m_pixels.swap(other.m_pixels);
			return *this;
		}